

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

iterator_element * __thiscall
Disa::Matrix_Sparse::lower_bound
          (iterator_element *__return_storage_ptr__,Matrix_Sparse *this,size_t *i_row,
          size_t *i_column)

{
  pointer puVar1;
  ulong uVar2;
  pointer puVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  i_column_00;
  long lVar4;
  
  puVar1 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if ((lVar4 == 0) || (uVar2 = *i_row, (lVar4 >> 3) - 1U <= uVar2)) {
    end((Matrix_Sparse *)&stack0xffffffffffffffd8);
    Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
              (__return_storage_ptr__,
               (Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&stack0xffffffffffffffd8);
  }
  else {
    puVar3 = (this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    i_column_00 = std::
                  __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (puVar3 + puVar1[uVar2],puVar3 + puVar1[uVar2 + 1],i_column);
    Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
              (__return_storage_ptr__,this,i_row,i_column_00._M_current,
               (pointer)((long)i_column_00._M_current +
                        ((long)(this->element_value).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start -
                        (long)(this->column_index).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start)));
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix_Sparse::iterator_element Matrix_Sparse::lower_bound(const std::size_t& i_row, const std::size_t& i_column) {
  if(i_row < size_row()) {
    const auto& iter_start = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row]);
    const auto& iter_end = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row + 1]);
    const auto& iter_lower = std::lower_bound(iter_start, iter_end, i_column);
    return {this, i_row, &*iter_lower, &*(element_value.begin() + std::distance(column_index.begin(), iter_lower))};
  } else return (*end()).end();
}